

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CodeLocation.cpp
# Opt level: O3

string * __thiscall
soul::CodeLocationRange::toString_abi_cxx11_(string *__return_storage_ptr__,CodeLocationRange *this)

{
  SourceCodeText *pSVar1;
  char *pcVar2;
  
  pSVar1 = (this->end).sourceCode.object;
  if ((this->start).sourceCode.object == (SourceCodeText *)0x0) {
    if (pSVar1 == (SourceCodeText *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    throwInternalCompilerError("end.sourceCode == nullptr","toString",0xe2);
  }
  if ((pSVar1 != (SourceCodeText *)0x0) &&
     (pcVar2 = (this->start).location.data, pcVar2 <= (this->end).location.data)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2);
    return __return_storage_ptr__;
  }
  throwInternalCompilerError
            ("end.sourceCode != nullptr && end.location.getAddress() >= start.location.getAddress()"
             ,"toString",0xe6);
}

Assistant:

std::string CodeLocationRange::toString() const
{
    if (start.sourceCode == nullptr)
    {
        SOUL_ASSERT (end.sourceCode == nullptr);
        return {};
    }

    SOUL_ASSERT (end.sourceCode != nullptr && end.location.getAddress() >= start.location.getAddress());
    return std::string (start.location.getAddress(), end.location.getAddress());
}